

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

void idle_2_close_cb(uv_handle_t *handle)

{
  char *pcVar1;
  undefined8 uStack_20;
  
  fputs("IDLE_2_CLOSE_CB\n",_stderr);
  fflush(_stderr);
  if ((uv_idle_t *)handle == &idle_2_handle) {
    if (idle_2_is_active != '\0') {
      idle_2_close_cb_called = idle_2_close_cb_called + 1;
      idle_2_is_active = 0;
      return;
    }
    pcVar1 = "idle_2_is_active";
    uStack_20 = 0x79;
  }
  else {
    pcVar1 = "handle == (uv_handle_t*)&idle_2_handle";
    uStack_20 = 0x77;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
          ,uStack_20,pcVar1);
  abort();
}

Assistant:

static void idle_2_close_cb(uv_handle_t* handle) {
  fprintf(stderr, "%s", "IDLE_2_CLOSE_CB\n");
  fflush(stderr);

  ASSERT(handle == (uv_handle_t*)&idle_2_handle);

  ASSERT(idle_2_is_active);

  idle_2_close_cb_called++;
  idle_2_is_active = 0;
}